

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckLabel(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  int iVar2;
  AttVal *av;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    av = prvTidyAttrGetById(node,TidyAttr_FOR);
    BVar1 = hasValue(av);
    if (BVar1 != no) {
      (doc->access).HasValidFor = yes;
    }
    iVar2 = (doc->access).ForID + 1;
    (doc->access).ForID = iVar2;
    if (iVar2 == 2) {
      (doc->access).ForID = 0;
      CheckFormControls(doc,node);
      return;
    }
  }
  return;
}

Assistant:

static void CheckLabel( TidyDocImpl* doc, Node* node )
{
    if (Level2_Enabled( doc ))
    {    
        /* Checks for valid 'FOR' attribute */
        AttVal* av = attrGetFOR( node );
        if ( hasValue(av) )
            doc->access.HasValidFor = yes;

        if ( ++doc->access.ForID == 2 )
        {
            doc->access.ForID = 0;
            CheckFormControls( doc, node );
        }
    }
}